

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O2

void Wln_NtkRetimeTest(char *pFileName,int fSkipSimple,int fVerbose)

{
  void *pData;
  Wln_Ntk_t *pNtk;
  Vec_Int_t *p;
  
  pData = Ndr_Read(pFileName);
  if (pData != (void *)0x0) {
    pNtk = Wln_NtkFromNdr(pData);
    if (pNtk != (Wln_Ntk_t *)0x0) {
      Ndr_Delete(pData);
      Wln_NtkRetimeCreateDelayInfo(pNtk);
      p = Wln_NtkRetime(pNtk,fSkipSimple,fVerbose);
      Vec_IntFree(p);
      Wln_NtkFree(pNtk);
      return;
    }
  }
  puts("Retiming network is not available.");
  return;
}

Assistant:

void Wln_NtkRetimeTest( char * pFileName, int fSkipSimple, int fVerbose )
{
    Vec_Int_t * vMoves;
    void * pData = Ndr_Read( pFileName );
    Wln_Ntk_t * pNtk = pData ? Wln_NtkFromNdr( pData ) : NULL;
    if ( pNtk == NULL ) 
    {
        printf( "Retiming network is not available.\n" );
        return;
    }
    Ndr_Delete( pData );
    Wln_NtkRetimeCreateDelayInfo( pNtk );
    vMoves = Wln_NtkRetime( pNtk, fSkipSimple, fVerbose );
    //Vec_IntPrint( vMoves );
    Vec_IntFree( vMoves );
    Wln_NtkFree( pNtk );
}